

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

wchar_t tree_current_is_physical_dir(tree *t)

{
  wchar_t wVar1;
  stat *psVar2;
  
  if ((t->flags & 0x10) != 0) {
    psVar2 = tree_current_stat(t);
    if (psVar2 == (stat *)0x0) {
      return L'\0';
    }
    if ((psVar2->st_mode & 0xf000) != 0x4000) {
      return L'\0';
    }
  }
  psVar2 = tree_current_lstat(t);
  if (psVar2 == (stat *)0x0) {
    wVar1 = L'\0';
  }
  else {
    wVar1 = (wchar_t)((psVar2->st_mode & 0xf000) == 0x4000);
  }
  return wVar1;
}

Assistant:

static int
tree_current_is_physical_dir(struct tree *t)
{
	const struct stat *st;

	/*
	 * If stat() says it isn't a dir, then it's not a dir.
	 * If stat() data is cached, this check is free, so do it first.
	 */
	if (t->flags & hasStat) {
		st = tree_current_stat(t);
		if (st == NULL)
			return (0);
		if (!S_ISDIR(st->st_mode))
			return (0);
	}

	/*
	 * Either stat() said it was a dir (in which case, we have
	 * to determine whether it's really a link to a dir) or
	 * stat() info wasn't available.  So we use lstat(), which
	 * hopefully is already cached.
	 */

	st = tree_current_lstat(t);
	/* If we can't stat it, it's not a dir. */
	if (st == NULL)
		return 0;
	/* Use the definitive test.  Hopefully this is cached. */
	return (S_ISDIR(st->st_mode));
}